

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O3

void __thiscall Network::check_consistency(Network *this)

{
  pointer psVar1;
  ulong uVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  ulong uVar7;
  
  uVar2 = (ulong)((long)(this->node_list).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->node_list).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  if ((int)uVar2 != 0) {
    psVar1 = (this->links).
             super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = 0;
    do {
      for (p_Var3 = *(_Base_ptr *)((long)&psVar1[uVar7]._M_t._M_impl.super__Rb_tree_header + 0x10);
          p_Var3 != &psVar1[uVar7]._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        p_Var4 = *(_Base_ptr *)
                  ((long)&psVar1[p_Var3[1]._M_color]._M_t._M_impl.super__Rb_tree_header + 8);
        if (p_Var4 == (_Base_ptr)0x0) {
LAB_00106b47:
          __assert_fail("links[node_j].count(node_i) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/network.h"
                        ,0x5b,"void Network::check_consistency() const");
        }
        p_Var6 = &psVar1[p_Var3[1]._M_color]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var5 = p_Var6;
        do {
          if (uVar7 <= p_Var4[1]._M_color) {
            p_Var5 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[p_Var4[1]._M_color < uVar7];
        } while (p_Var4 != (_Base_ptr)0x0);
        if ((p_Var5 == p_Var6) || (uVar7 < p_Var5[1]._M_color)) goto LAB_00106b47;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar2 & 0xffffffff));
  }
  return;
}

Assistant:

void check_consistency() const {
        for (unsigned int node_i = 0; node_i < getN(); node_i++)
            for(unsigned int node_j : links[node_i])
                assert(links[node_j].count(node_i) == 1);
    }